

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgemm.hpp
# Opt level: O3

void remora::bindings::mgemm<float,float,remora::bindings::gemm_block_size<float>>
               (float alpha,ulong mc,ulong nc,size_t kc,long A,long B,float *C,size_t stride1,
               size_t stride2)

{
  float *pfVar1;
  float *pfVar2;
  float *B_00;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  float *pfVar6;
  float *pfVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  float CTempBlock [64];
  float *local_1e8;
  ulong local_1e0;
  float local_138 [66];
  
  if (0xf < nc + 0xf) {
    local_1e0 = 0;
    uVar4 = nc;
    local_1e8 = C;
    do {
      uVar11 = 0x10;
      if (uVar4 < 0x10) {
        uVar11 = uVar4;
      }
      if (3 < mc + 3) {
        B_00 = (float *)(kc * 0x40 * local_1e0 + B);
        uVar10 = 0;
        pfVar6 = local_1e8;
        uVar9 = mc;
        do {
          uVar5 = 4;
          if (uVar9 < 4) {
            uVar5 = uVar9;
          }
          if (mc + uVar10 * -4 < 4 || nc + local_1e0 * -0x10 < 0x10) {
            memset(local_138,0,0x100);
            ugemm<remora::bindings::gemm_block_size<float>,float,float>
                      (kc,alpha,(float *)(kc * 0x10 * uVar10 + A),B_00,local_138,0x10,1);
            if (mc != uVar10 * 4) {
              pfVar1 = local_138;
              lVar3 = 0;
              pfVar2 = pfVar6;
              do {
                if (nc != local_1e0 * 0x10) {
                  lVar8 = 0;
                  pfVar7 = pfVar2;
                  do {
                    *pfVar7 = pfVar1[lVar8] + *pfVar7;
                    lVar8 = lVar8 + 1;
                    pfVar7 = pfVar7 + stride2;
                  } while (uVar11 + (uVar11 == 0) != lVar8);
                }
                lVar3 = lVar3 + 1;
                pfVar2 = pfVar2 + stride1;
                pfVar1 = pfVar1 + 0x10;
              } while (lVar3 != uVar5 + (uVar5 == 0));
            }
          }
          else {
            ugemm<remora::bindings::gemm_block_size<float>,float,float>
                      (kc,alpha,(float *)(kc * 0x10 * uVar10 + A),B_00,
                       C + local_1e0 * 0x10 * stride2 + uVar10 * 4 * stride1,stride1,stride2);
          }
          uVar10 = uVar10 + 1;
          uVar9 = uVar9 - 4;
          pfVar6 = pfVar6 + stride1 * 4;
        } while (uVar10 != mc + 3 >> 2);
      }
      local_1e0 = local_1e0 + 1;
      uVar4 = uVar4 - 0x10;
      local_1e8 = local_1e8 + stride2 * 0x10;
    } while (local_1e0 != nc + 0xf >> 4);
  }
  return;
}

Assistant:

void mgemm(
	std::size_t mc, std::size_t nc, std::size_t kc, TC alpha,
	T const* A, T const* B, TC *C,
	std::size_t stride1, std::size_t stride2, block_size
){
	static std::size_t const MR = block_size::mr;
	static std::size_t const NR = block_size::nr;
	std::size_t const mp  = (mc+MR-1) / MR;
	std::size_t const np  = (nc+NR-1) / NR;

	for (std::size_t j=0; j<np; ++j) {
		std::size_t const nr = std::min(NR, nc - j*NR);

		for (std::size_t i=0; i<mp; ++i) {
			std::size_t const mr = std::min(MR, mc - i*MR);
			auto CBlockStart = C+i*MR*stride1+j*NR*stride2;
			if (mr==MR && nr==NR) {
				ugemm<block_size>(
					kc, alpha,
					&A[i*kc*MR], &B[j*kc*NR],
					CBlockStart, stride1, stride2
				);
			} else {
				TC CTempBlock[MR*NR];
				std::fill_n(CTempBlock, MR*NR, T(0));
				ugemm<block_size>(
					kc, alpha,
					&A[i*kc*MR], &B[j*kc*NR],
					CTempBlock, NR, 1
				);

				for (std::size_t i0=0; i0<mr; ++i0){
					for (std::size_t j0=0; j0<nr; ++j0) {
						CBlockStart[i0*stride1+j0 * stride2] += CTempBlock[i0*NR+j0];
					}
				}
			}
		}
	}
}